

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

handle pybind11::detail::
       map_caster<std::map<unsigned_long,std::vector<long,std::allocator<long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<long,std::allocator<long>>>>>,unsigned_long,std::vector<long,std::allocator<long>>>
       ::
       cast<std::map<unsigned_long,std::vector<long,std::allocator<long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<long,std::allocator<long>>>>>>
                 (map<unsigned_long,_std::vector<long,_std::allocator<long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<long,_std::allocator<long>_>_>_>_>
                  *src,return_value_policy policy,handle parent)

{
  _Rb_tree_node_base *p_Var1;
  handle hVar2;
  dict d;
  object key;
  object value;
  handle local_68;
  handle local_60;
  object local_58;
  item_accessor local_50;
  
  dict::dict((dict *)&local_68);
  p_Var1 = *(_Rb_tree_node_base **)(src + 0x18);
  do {
    hVar2.m_ptr = local_68.m_ptr;
    if (p_Var1 == (_Rb_tree_node_base *)(src + 8)) {
      local_68.m_ptr = (PyObject *)0x0;
LAB_002025e7:
      object::~object((object *)&local_68);
      return (handle)hVar2.m_ptr;
    }
    local_60.m_ptr = (PyObject *)PyLong_FromSize_t(*(undefined8 *)(p_Var1 + 1));
    local_58.super_handle =
         list_caster<std::vector<long,std::allocator<long>>,long>::
         cast<std::vector<long,std::allocator<long>>>
                   ((vector<long,_std::allocator<long>_> *)&p_Var1[1]._M_parent,policy,parent);
    if ((local_60.m_ptr == (PyObject *)0x0) || (local_58.super_handle.m_ptr == (PyObject *)0x0)) {
      object::~object(&local_58);
      object::~object((object *)&local_60);
      hVar2.m_ptr = (PyObject *)0x0;
      goto LAB_002025e7;
    }
    object_api<pybind11::handle>::operator[]
              (&local_50,(object_api<pybind11::handle> *)&local_68,local_60);
    accessor<pybind11::detail::accessor_policies::generic_item>::operator=(&local_50,&local_58);
    accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_50);
    object::~object(&local_58);
    object::~object((object *)&local_60);
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  } while( true );
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        dict d;
        return_value_policy policy_key = policy;
        return_value_policy policy_value = policy;
        if (!std::is_lvalue_reference<T>::value) {
            policy_key = return_value_policy_override<Key>::policy(policy_key);
            policy_value = return_value_policy_override<Value>::policy(policy_value);
        }
        for (auto &&kv : src) {
            auto key = reinterpret_steal<object>(key_conv::cast(forward_like<T>(kv.first), policy_key, parent));
            auto value = reinterpret_steal<object>(value_conv::cast(forward_like<T>(kv.second), policy_value, parent));
            if (!key || !value)
                return handle();
            d[key] = value;
        }
        return d.release();
    }